

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

void __thiscall hwnet::TCPSocket::linklist::pop_front(linklist *this)

{
  sendContext *s;
  sendContext *psVar1;
  
  s = this->head;
  if (s != (sendContext *)0x0) {
    psVar1 = s->next;
    this->head = psVar1;
    if (psVar1 == (sendContext *)0x0) {
      this->tail = (sendContext *)0x0;
    }
    putSendContext(s);
    return;
  }
  return;
}

Assistant:

void pop_front() {
			if(this->head != nullptr){
				auto s = this->head;
				this->head = s->next;
				if(nullptr == this->head) {
					this->tail = nullptr;
				}
				putSendContext(s);
			}
		}